

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t duckdb::HexIntegralOperator::Operation<unsigned_long,duckdb::string_t>
                   (unsigned_long input,Vector *result)

{
  idx_t iVar1;
  idx_t len;
  char *pcVar2;
  Vector *vector;
  string_t target;
  char *output;
  
  iVar1 = CountZeros<unsigned_long>::Leading(input);
  if (0x43 - iVar1 < 4) {
    target = StringVector::EmptyString((StringVector *)result,(Vector *)0x1,len);
    pcVar2 = target.value._8_8_;
    if (target.value._0_4_ < 0xd) {
      pcVar2 = target.value.pointer.prefix;
    }
    *pcVar2 = '0';
  }
  else {
    vector = (Vector *)(0x43 - iVar1 >> 2);
    target = StringVector::EmptyString((StringVector *)result,vector,len);
    output = target.value._8_8_;
    if (target.value._0_4_ < 0xd) {
      output = target.value.pointer.prefix;
    }
    WriteHexBytes(input,&output,(idx_t)vector);
  }
  string_t::Finalize(&target);
  return (string_t)target.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		auto num_leading_zero = CountZeros<uint64_t>::Leading(static_cast<uint64_t>(input));
		idx_t num_bits_to_check = 64 - num_leading_zero;
		D_ASSERT(num_bits_to_check <= sizeof(INPUT_TYPE) * 8);

		idx_t buffer_size = (num_bits_to_check + 3) / 4;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHexBytes(static_cast<uint64_t>(input), output, buffer_size);

		target.Finalize();
		return target;
	}